

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

UBool __thiscall icu_63::RegexMatcher::isChunkWordBoundary(RegexMatcher *this,int32_t pos)

{
  UChar UVar1;
  UChar *pUVar2;
  bool bVar3;
  UBool UVar4;
  int8_t iVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint c;
  
  pUVar2 = this->fInputText->chunkContents;
  lVar10 = (long)pos;
  if (this->fLookLimit <= lVar10) {
    this->fHitEnd = '\x01';
    bVar6 = 0;
    goto LAB_0023fdf7;
  }
  UVar1 = pUVar2[lVar10];
  c = (uint)(ushort)UVar1;
  uVar11 = (uint)(ushort)UVar1;
  if ((UVar1 & 0xf800U) == 0xd800) {
    if (((ushort)UVar1 >> 10 & 1) == 0) {
      if ((this->fLookLimit != (long)(pos + 1)) &&
         (uVar8 = (uint)(ushort)pUVar2[pos + 1], (pUVar2[pos + 1] & 0xfc00U) == 0xdc00)) {
        uVar11 = (uint)(ushort)UVar1 << 10;
LAB_0023fd9f:
        c = uVar11 + uVar8 + 0xfca02400;
      }
    }
    else if ((this->fLookStart < lVar10) && ((pUVar2[lVar10 + -1] & 0xfc00U) == 0xd800)) {
      uVar8 = (uint)(ushort)pUVar2[lVar10 + -1] << 10;
      goto LAB_0023fd9f;
    }
  }
  UVar4 = u_hasBinaryProperty_63(c,UCHAR_GRAPHEME_EXTEND);
  bVar6 = 0;
  bVar3 = false;
  if (UVar4 == '\0') {
    iVar5 = u_charType_63(c);
    bVar6 = 0;
    bVar3 = false;
    if (iVar5 != '\x10') {
      bVar6 = UnicodeSet::contains(this->fPattern->fStaticSets[1],c);
      bVar3 = true;
    }
  }
  if (!bVar3) {
    return '\0';
  }
LAB_0023fdf7:
  bVar7 = 0;
  do {
    lVar10 = (long)pos;
    if (lVar10 <= this->fLookStart) break;
    iVar9 = pos + -1;
    uVar11 = (uint)(ushort)pUVar2[lVar10 + -1];
    if (((this->fLookStart < lVar10 + -1) && ((uVar11 & 0xfc00) == 0xdc00)) &&
       ((pUVar2[lVar10 + -2] & 0xfc00U) == 0xd800)) {
      uVar11 = (uint)(ushort)pUVar2[lVar10 + -1] + (uint)(ushort)pUVar2[lVar10 + -2] * 0x400 +
               0xfca02400;
      iVar9 = pos + -2;
    }
    pos = iVar9;
    UVar4 = u_hasBinaryProperty_63(uVar11,UCHAR_GRAPHEME_EXTEND);
    bVar3 = true;
    if ((UVar4 == '\0') && (iVar5 = u_charType_63(uVar11), iVar5 != '\x10')) {
      bVar7 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar11);
      bVar3 = false;
    }
  } while (bVar3);
  return bVar7 ^ bVar6;
}

Assistant:

UBool RegexMatcher::isChunkWordBoundary(int32_t pos) {
    UBool isBoundary = FALSE;
    UBool cIsWord    = FALSE;

    const UChar *inputBuf = fInputText->chunkContents;

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
    } else {
        // Determine whether char c at current position is a member of the word set of chars.
        // If we're off the end of the string, behave as though we're not at a word char.
        UChar32 c;
        U16_GET(inputBuf, fLookStart, pos, fLookLimit, c);
        if (u_hasBinaryProperty(c, UCHAR_GRAPHEME_EXTEND) || u_charType(c) == U_FORMAT_CHAR) {
            // Current char is a combining one.  Not a boundary.
            return FALSE;
        }
        cIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(c);
    }

    // Back up until we come to a non-combining char, determine whether
    //  that char is a word char.
    UBool prevCIsWord = FALSE;
    for (;;) {
        if (pos <= fLookStart) {
            break;
        }
        UChar32 prevChar;
        U16_PREV(inputBuf, fLookStart, pos, prevChar);
        if (!(u_hasBinaryProperty(prevChar, UCHAR_GRAPHEME_EXTEND)
              || u_charType(prevChar) == U_FORMAT_CHAR)) {
            prevCIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(prevChar);
            break;
        }
    }
    isBoundary = cIsWord ^ prevCIsWord;
    return isBoundary;
}